

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O2

uint8_t bcm2835_i2c_read_register_rs(char *regaddr,char *buf,uint32_t len)

{
  uint32_t *paddr;
  uint32_t *paddr_00;
  uint32_t *paddr_01;
  uint32_t *paddr_02;
  uint32_t uVar1;
  uint8_t uVar2;
  ulong uVar3;
  
  paddr_02 = bcm2835_bsc1;
  paddr = bcm2835_bsc1 + 2;
  paddr_00 = bcm2835_bsc1 + 4;
  paddr_01 = bcm2835_bsc1 + 1;
  bcm2835_peri_set_bits(bcm2835_bsc1,0x20,0x20);
  bcm2835_peri_write(paddr_01,0x302);
  bcm2835_peri_write(paddr,1);
  bcm2835_peri_write(paddr_02,0x8000);
  bcm2835_peri_write(paddr_00,(int)*regaddr);
  bcm2835_peri_write(paddr_02,0x8080);
  do {
    uVar1 = bcm2835_peri_read(paddr_01);
    if ((uVar1 & 1) != 0) break;
    uVar1 = bcm2835_peri_read(paddr_01);
  } while ((uVar1 & 2) == 0);
  bcm2835_peri_write(paddr,len);
  bcm2835_peri_write(paddr_02,0x8081);
  bcm2835_delayMicroseconds((long)i2c_byte_wait_us * 3);
  uVar3 = 0;
LAB_0010263b:
  uVar1 = bcm2835_peri_read(paddr_01);
  if ((uVar1 & 2) == 0) {
    while( true ) {
      if (len == 0) break;
      uVar1 = bcm2835_peri_read(paddr_01);
      if ((uVar1 & 0x20) == 0) break;
      uVar1 = bcm2835_peri_read(paddr_00);
      buf[uVar3] = (char)uVar1;
      uVar3 = (ulong)((int)uVar3 + 1);
      len = len - 1;
    }
    goto LAB_0010263b;
  }
  while( true ) {
    if (len == 0) break;
    uVar1 = bcm2835_peri_read(paddr_01);
    if ((uVar1 & 0x20) == 0) break;
    uVar1 = bcm2835_peri_read(paddr_00);
    buf[uVar3] = (char)uVar1;
    uVar3 = (ulong)((int)uVar3 + 1);
    len = len - 1;
  }
  uVar1 = bcm2835_peri_read(paddr_01);
  uVar2 = '\x01';
  if ((uVar1 >> 8 & 1) == 0) {
    uVar1 = bcm2835_peri_read(paddr_01);
    uVar2 = (len != 0) << 2;
    if ((uVar1 >> 9 & 1) != 0) {
      uVar2 = '\x02';
    }
  }
  bcm2835_peri_set_bits(paddr_02,2,2);
  return uVar2;
}

Assistant:

uint8_t bcm2835_i2c_read_register_rs(char* regaddr, char* buf, uint32_t len)
{   
#ifdef I2C_V1
    volatile uint32_t* dlen    = bcm2835_bsc0 + BCM2835_BSC_DLEN/4;
    volatile uint32_t* fifo    = bcm2835_bsc0 + BCM2835_BSC_FIFO/4;
    volatile uint32_t* status  = bcm2835_bsc0 + BCM2835_BSC_S/4;
    volatile uint32_t* control = bcm2835_bsc0 + BCM2835_BSC_C/4;
#else
    volatile uint32_t* dlen    = bcm2835_bsc1 + BCM2835_BSC_DLEN/4;
    volatile uint32_t* fifo    = bcm2835_bsc1 + BCM2835_BSC_FIFO/4;
    volatile uint32_t* status  = bcm2835_bsc1 + BCM2835_BSC_S/4;
    volatile uint32_t* control = bcm2835_bsc1 + BCM2835_BSC_C/4;
#endif    
	uint32_t remaining = len;
    uint32_t i = 0;
    uint8_t reason = BCM2835_I2C_REASON_OK;
    
    /* Clear FIFO */
    bcm2835_peri_set_bits(control, BCM2835_BSC_C_CLEAR_1 , BCM2835_BSC_C_CLEAR_1 );
    /* Clear Status */
    bcm2835_peri_write(status, BCM2835_BSC_S_CLKT | BCM2835_BSC_S_ERR | BCM2835_BSC_S_DONE);
    /* Set Data Length */
    bcm2835_peri_write(dlen, 1);
    /* Enable device and start transfer */
    bcm2835_peri_write(control, BCM2835_BSC_C_I2CEN);
    bcm2835_peri_write(fifo, regaddr[0]);
    bcm2835_peri_write(control, BCM2835_BSC_C_I2CEN | BCM2835_BSC_C_ST);
    
    /* poll for transfer has started */
    while ( !( bcm2835_peri_read(status) & BCM2835_BSC_S_TA ) )
    {
        /* Linux may cause us to miss entire transfer stage */
        if(bcm2835_peri_read(status) & BCM2835_BSC_S_DONE)
            break;
    }
    
    /* Send a repeated start with read bit set in address */
    bcm2835_peri_write(dlen, len);
    bcm2835_peri_write(control, BCM2835_BSC_C_I2CEN | BCM2835_BSC_C_ST  | BCM2835_BSC_C_READ );
    
    /* Wait for write to complete and first byte back. */
    bcm2835_delayMicroseconds(i2c_byte_wait_us * 3);
    
    /* wait for transfer to complete */
    while (!(bcm2835_peri_read(status) & BCM2835_BSC_S_DONE))
    {
        /* we must empty the FIFO as it is populated and not use any delay */
        while (remaining && bcm2835_peri_read(status) & BCM2835_BSC_S_RXD)
    	{
	    /* Read from FIFO */
	    buf[i] = bcm2835_peri_read(fifo);
	    i++;
	    remaining--;
    	}
    }
    
    /* transfer has finished - grab any remaining stuff in FIFO */
    while (remaining && (bcm2835_peri_read(status) & BCM2835_BSC_S_RXD))
    {
        /* Read from FIFO */
        buf[i] = bcm2835_peri_read(fifo);
        i++;
        remaining--;
    }
    
    /* Received a NACK */
    if (bcm2835_peri_read(status) & BCM2835_BSC_S_ERR)
    {
		reason = BCM2835_I2C_REASON_ERROR_NACK;
    }

    /* Received Clock Stretch Timeout */
    else if (bcm2835_peri_read(status) & BCM2835_BSC_S_CLKT)
    {
	reason = BCM2835_I2C_REASON_ERROR_CLKT;
    }

    /* Not all data is sent */
    else if (remaining)
    {
	reason = BCM2835_I2C_REASON_ERROR_DATA;
    }

    bcm2835_peri_set_bits(control, BCM2835_BSC_S_DONE , BCM2835_BSC_S_DONE);

    return reason;
}